

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O2

unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> __thiscall
duckdb::ChunkConstantInfo::Read(ChunkConstantInfo *this,ReadStream *reader)

{
  pointer pCVar1;
  unsigned_long start;
  _Tuple_impl<0UL,_duckdb::ChunkConstantInfo_*,_std::default_delete<duckdb::ChunkConstantInfo>_>
  local_20;
  unsigned_long local_18;
  
  local_18 = ReadStream::Read<unsigned_long>(reader);
  make_uniq<duckdb::ChunkConstantInfo,unsigned_long&>((duckdb *)&local_20,&local_18);
  pCVar1 = unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
                         *)&local_20);
  pCVar1->insert_id = 0;
  pCVar1 = unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
                         *)&local_20);
  pCVar1->delete_id = 0;
  (this->super_ChunkInfo)._vptr_ChunkInfo =
       (_func_int **)local_20.super__Head_base<0UL,_duckdb::ChunkConstantInfo_*,_false>._M_head_impl
  ;
  return (unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)
         (unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)this;
}

Assistant:

unique_ptr<ChunkInfo> ChunkConstantInfo::Read(ReadStream &reader) {
	auto start = reader.Read<idx_t>();
	auto info = make_uniq<ChunkConstantInfo>(start);
	info->insert_id = 0;
	info->delete_id = 0;
	return std::move(info);
}